

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

int mapEndSurfaceHeight(float *y,EndNoise *en,SurfaceNoise *sn,int x,int z,int w,int h,int scale,
                       int ymin)

{
  ulong uVar1;
  int colymin;
  int iVar2;
  int iVar3;
  double *__ptr;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  uint uVar12;
  double *pdVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  ulong uVar13;
  
  iVar2 = 1;
  if (((uint)scale < 9) && ((0x116U >> (scale & 0x1fU) & 1) != 0)) {
    iVar2 = 2;
    if (2 < ymin >> 2) {
      iVar2 = ymin >> 2;
    }
    colymin = 0x11;
    if (iVar2 < 0x11) {
      colymin = iVar2;
    }
    uVar12 = 0x13 - colymin;
    uVar13 = (ulong)uVar12;
    if (scale < 2) {
      dVar18 = 0.0;
    }
    else {
      dVar18 = (double)scale * 0.0625;
    }
    iVar7 = (int)(8 / (ulong)(uint)scale);
    iVar8 = x / iVar7 - (uint)(x % iVar7 != 0 && x < 0);
    iVar2 = w + x + -1;
    uVar5 = ((iVar2 / iVar7 - iVar8) - (uint)(iVar2 % iVar7 != 0 && w + x < 1)) + 2;
    __ptr = (double *)malloc(uVar13 * (long)(int)uVar5 * 0x10);
    if (0 < (int)uVar5) {
      lVar17 = -(ulong)uVar5;
      pdVar10 = __ptr + (int)(uVar12 * uVar5);
      iVar2 = iVar8;
      do {
        sampleNoiseColumnEnd
                  (pdVar10,sn,en,iVar2,z / iVar7 - (uint)(z < 0 && z % iVar7 != 0),colymin,0x12);
        iVar2 = iVar2 + 1;
        pdVar10 = pdVar10 + uVar13;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0);
    }
    if (0 < h) {
      uVar9 = 0;
      pdVar10 = __ptr + (int)(uVar12 * uVar5);
      pdVar14 = __ptr;
      do {
        uVar15 = uVar9 + (long)z;
        uVar1 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)iVar7) -
                (uint)((int)((long)uVar1 % (long)iVar7) != 0 && (long)uVar15 < 0);
        iVar4 = (int)uVar15 - iVar2 * iVar7;
        pdVar6 = pdVar10;
        pdVar11 = pdVar14;
        if ((uVar9 == 0 || iVar4 == 0) && (pdVar6 = pdVar14, pdVar11 = pdVar10, 0 < (int)uVar5)) {
          lVar17 = -(ulong)uVar5;
          iVar16 = iVar8;
          do {
            sampleNoiseColumnEnd(pdVar14,sn,en,iVar16,iVar2 + 1,colymin,0x12);
            iVar16 = iVar16 + 1;
            pdVar14 = pdVar14 + uVar13;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0);
        }
        if (0 < w) {
          lVar17 = 0;
          iVar2 = 0;
          uVar15 = (long)x;
          do {
            uVar1 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
            iVar16 = (int)((long)uVar1 / (long)iVar7) -
                     (uint)((int)((long)uVar1 % (long)iVar7) != 0 && (long)uVar15 < 0);
            iVar3 = (iVar16 - iVar8) * uVar12;
            iVar16 = getSurfaceHeight(pdVar11 + iVar3,pdVar6 + iVar3,pdVar11 + iVar3 + uVar13,
                                      pdVar6 + iVar3 + uVar13,colymin,0x12,4,
                                      (double)((x + iVar2) - iVar16 * iVar7) / (double)iVar7 +
                                      dVar18,(double)iVar4 / (double)iVar7 + dVar18);
            *(float *)((long)y + lVar17) = (float)iVar16;
            iVar2 = iVar2 + 1;
            lVar17 = lVar17 + 4;
            uVar15 = uVar15 + 1;
          } while ((ulong)(uint)w * 4 != lVar17);
        }
        uVar9 = uVar9 + 1;
        y = y + (uint)w;
        pdVar10 = pdVar6;
        pdVar14 = pdVar11;
      } while (uVar9 != (uint)h);
    }
    free(__ptr);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapEndSurfaceHeight(float *y, const EndNoise *en, const SurfaceNoise *sn,
    int x, int z, int w, int h, int scale, int ymin)
{
    if (scale != 1 && scale != 2 && scale != 4 && scale != 8)
        return 1;

    int y0 = ymin >> 2;
    if (y0 <  2) y0 =  2;
    if (y0 > 17) y0 = 17;
    int y1 = 18;
    int yn = y1 - y0 + 1;
    double cellmid = scale > 1 ? scale / 16.0 : 0;
    int cellsiz = 8 / scale;
    int cx = floordiv(x, cellsiz);
    int cz = floordiv(z, cellsiz);
    int cw = floordiv(x + w - 1, cellsiz) - cx + 2;
    int i, j;

    double *buf = malloc(sizeof(double) * yn * cw * 2);
    double *ncol[2];
    ncol[0] = buf;
    ncol[1] = buf + yn * cw;

    for (i = 0; i < cw; i++)
        sampleNoiseColumnEnd(ncol[1]+i*yn, sn, en, cx+i, cz+0, y0, y1);

    for (j = 0; j < h; j++)
    {
        int cj = floordiv(z + j, cellsiz);
        int dj = z + j - cj * cellsiz;
        if (j == 0 || dj == 0)
        {
            double *tmp = ncol[0];
            ncol[0] = ncol[1];
            ncol[1] = tmp;
            for (i = 0; i < cw; i++)
                sampleNoiseColumnEnd(ncol[1]+i*yn, sn, en, cx+i, cj+1, y0, y1);
        }

        for (i = 0; i < w; i++)
        {
            int ci = floordiv(x + i, cellsiz);
            int di = x + i - ci * cellsiz;
            double dx = di / (double) cellsiz + cellmid;
            double dz = dj / (double) cellsiz + cellmid;
            double *ncol0 = ncol[0] + (ci - cx) * yn;
            double *ncol1 = ncol[1] + (ci - cx) * yn;
            y[j*w+i] = getSurfaceHeight(ncol0, ncol1, ncol0+yn, ncol1+yn,
                y0, y1, 4, dx, dz);
        }
    }

    free(buf);
    return 0;
}